

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)4>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  undefined1 auVar1 [14];
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  RunResult RVar5;
  RunResult RVar6;
  Value value;
  Simd<unsigned_short,_(unsigned_char)__x04_> local_10;
  
  RVar5 = Load<wabt::interp::Simd<unsigned_short,(unsigned_char)4>>(this,instr,&local_10,out_trap);
  RVar6 = Trap;
  if (RVar5 == Ok) {
    auVar1._8_4_ = 0;
    auVar1._0_2_ = local_10.v[0];
    auVar1._2_2_ = local_10.v[1];
    auVar1._4_2_ = local_10.v[2];
    auVar1._6_2_ = local_10.v[3];
    auVar1._12_2_ = local_10.v[3];
    auVar2._8_2_ = local_10.v[2];
    auVar2._0_2_ = local_10.v[0];
    auVar2._2_2_ = local_10.v[1];
    auVar2._4_2_ = local_10.v[2];
    auVar2._6_2_ = local_10.v[3];
    auVar2._10_4_ = auVar1._10_4_;
    auVar4._6_8_ = 0;
    auVar4._0_6_ = auVar2._8_6_;
    auVar3._6_8_ = SUB148(auVar4 << 0x40,6);
    auVar3._4_2_ = local_10.v[1];
    auVar3._2_2_ = 0;
    auVar3._0_2_ = local_10.v[0];
    value.field_0._0_8_ = auVar3._0_8_;
    value.field_0._12_4_ = auVar1._10_4_ >> 0x10;
    value.field_0._8_4_ = auVar2._8_4_;
    Push(this,value);
    RVar6 = Ok;
  }
  return RVar6;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}